

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O2

int __thiscall Fl_Pixmap::copy(Fl_Pixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  uint uVar2;
  Fl_Pixmap *this_00;
  char **ppcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int ncolors;
  int local_174;
  char **local_170;
  char **local_168;
  ulong local_160;
  int local_154;
  int local_150;
  int chars_per_pixel;
  ulong local_148;
  Fl_Pixmap *local_140;
  char new_info [255];
  
  iVar8 = (int)dst;
  iVar13 = (int)src;
  if (((this->super_Fl_Image).w_ == iVar8) && ((this->super_Fl_Image).h_ == iVar13)) {
    this_00 = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_00,(this->super_Fl_Image).data_);
    copy_data(this_00);
  }
  else if (iVar13 < 1 || iVar8 < 1) {
    this_00 = (Fl_Pixmap *)0x0;
  }
  else {
    __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&ncolors,&chars_per_pixel);
    local_174 = chars_per_pixel * iVar8 + 1;
    sprintf(new_info,"%d %d %d %d",(ulong)dst & 0xffffffff,(ulong)src & 0xffffffff,
            (ulong)(uint)ncolors);
    iVar11 = ncolors;
    iVar1 = (this->super_Fl_Image).w_;
    local_154 = (this->super_Fl_Image).h_;
    lVar17 = (long)chars_per_pixel;
    local_150 = local_154 / iVar13;
    local_154 = local_154 % iVar13;
    lVar15 = (long)ncolors;
    uVar2 = iVar13 + 1 + ncolors;
    if (lVar15 < 0) {
      uVar2 = iVar13 + 2;
    }
    local_160 = (ulong)(iVar1 / iVar8);
    local_148 = (ulong)src & 0xffffffff;
    ppcVar3 = (char **)operator_new__((ulong)uVar2 << 3);
    sVar4 = strlen(new_info);
    pcVar5 = (char *)operator_new__(sVar4 + 1);
    *ppcVar3 = pcVar5;
    strcpy(pcVar5,new_info);
    local_168 = ppcVar3;
    local_140 = this;
    if (lVar15 < 0) {
      ncolors = -iVar11;
      uVar7 = (ulong)(uint)(iVar11 * -4);
      pcVar5 = (char *)operator_new__(uVar7);
      ppcVar3[1] = pcVar5;
      memcpy(pcVar5,(this->super_Fl_Image).data_[1],uVar7);
      ncolors = 1;
      local_170 = ppcVar3 + 2;
    }
    else {
      local_170 = (this->super_Fl_Image).data_;
      for (lVar14 = 0; lVar15 << 3 != lVar14; lVar14 = lVar14 + 8) {
        pcVar5 = *(char **)((long)local_170 + lVar14 + 8);
        sVar4 = strlen(pcVar5);
        pcVar6 = (char *)operator_new__(sVar4 + 1);
        *(char **)((long)local_168 + lVar14 + 8) = pcVar6;
        strcpy(pcVar6,pcVar5);
      }
      local_170 = (char **)((long)local_168 + lVar14 + 8);
    }
    lVar17 = lVar17 * local_160;
    local_160 = (ulong)local_174;
    iVar13 = 0;
    uVar16 = local_148 & 0xffffffff;
    uVar7 = local_148 & 0xffffffff;
    while (0 < (int)uVar7) {
      local_174 = (int)uVar7;
      pcVar6 = (char *)operator_new__(local_160);
      *local_170 = pcVar6;
      pcVar5 = (local_140->super_Fl_Image).data_[(long)iVar13 + (long)ncolors + 1];
      uVar10 = (ulong)dst & 0xffffffff;
      for (uVar7 = (ulong)dst & 0xffffffff; 0 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
        for (lVar15 = 0; lVar15 < chars_per_pixel; lVar15 = lVar15 + 1) {
          pcVar6[lVar15] = pcVar5[lVar15];
        }
        iVar9 = (int)uVar10 - iVar1 % iVar8;
        iVar11 = chars_per_pixel;
        if (0 < iVar9) {
          iVar11 = 0;
        }
        iVar12 = 0;
        if (iVar9 < 1) {
          iVar12 = iVar8;
        }
        pcVar5 = pcVar5 + iVar11 + lVar17;
        uVar10 = (ulong)(uint)(iVar9 + iVar12);
        pcVar6 = pcVar6 + lVar15;
      }
      *pcVar6 = '\0';
      iVar9 = (int)uVar16 - local_154;
      iVar11 = 0;
      if (iVar9 < 1) {
        iVar11 = (int)local_148;
      }
      iVar13 = iVar13 + local_150 + (uint)(iVar9 < 1);
      uVar16 = (ulong)(uint)(iVar9 + iVar11);
      local_170 = local_170 + 1;
      uVar7 = (ulong)(local_174 - 1);
    }
    this_00 = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_00,local_168);
    this_00->alloc_data = 1;
  }
  return (int)this_00;
}

Assistant:

Fl_Image *Fl_Pixmap::copy(int W, int H) {
  Fl_Pixmap	*new_image;	// New pixmap

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    // Make an exact copy of the image and return it...
    new_image = new Fl_Pixmap(data());
    new_image->copy_data();
    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and
  char		**new_data,	// New array for image data
		**new_row,	// Pointer to row in image data
		*new_ptr,	// Pointer into new array
		new_info[255];	// New information line
  const char	*old_ptr;	// Pointer into old array
  int		i,		// Looping var
		c,		// Channel number
		sy,		// Source coordinate
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments
  int		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * W + 1;

  sprintf(new_info, "%d %d %d %d", W, H, ncolors, chars_per_pixel);

  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = (w() / W) * chars_per_pixel;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[H + 2];
  else new_data = new char *[H + ncolors + 1];
  new_data[0] = new char[strlen(new_info) + 1];
  strcpy(new_data[0], new_info);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H; dy > 0; dy --, new_row ++) {
    *new_row = new char[chars_per_line];
    new_ptr  = *new_row;

    for (dx = W, xerr = W, old_ptr = data()[sy + ncolors + 1];
	 dx > 0;
	 dx --) {
      for (c = 0; c < chars_per_pixel; c ++) *new_ptr++ = old_ptr[c];

      old_ptr += xstep;
      xerr    -= xmod;

      if (xerr <= 0) {
	xerr    += W;
	old_ptr += chars_per_pixel;
      }
    }

    *new_ptr = '\0';
    sy       += ystep;
    yerr     -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  new_image = new Fl_Pixmap((char*const*)new_data);
  new_image->alloc_data = 1;

  return new_image;
}